

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_basic.cpp
# Opt level: O0

void test_5(void)

{
  ChStreamOutAscii *pCVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1228;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1220;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1218;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1210;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1208;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1200;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_11f8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_11f0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_11e8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_11e0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_11d8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_11d0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_11c8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_11c0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_11b8;
  ChStreamOutAscii *local_11a8;
  double local_11a0;
  ChStreamOutAscii *local_1198;
  ChStreamOutAscii *local_1190;
  ChStreamOutAscii *local_1188;
  ChVector<double> *local_1180;
  ChStreamOutAscii *local_1178;
  ChStreamOutAscii *local_1170;
  ChStreamOutAscii *local_1168;
  ChVector<double> *local_1160;
  ChStreamOutAscii *local_1158;
  ChStreamOutAscii *local_1150;
  ChStreamOutAscii *local_1148;
  ChVector<double> *local_1140;
  ChStreamOutAscii *local_1138;
  ChStreamOutAscii *local_1130;
  ChStreamOutAscii *local_1128;
  ChVector<double> *local_1120;
  ChStreamOutAscii *local_1118;
  ChStreamOutAscii *local_1110;
  shared_ptr<chrono::ChSolver> *local_1108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_1100;
  shared_ptr<chrono::ChPhysicsItem> *local_10f8;
  shared_ptr<chrono::ChPhysicsItem> *local_10f0;
  shared_ptr<chrono::ChPhysicsItem> *local_10e8;
  element_type *local_10e0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_10d8;
  shared_ptr<chrono::ChBodyFrame> *local_10d0;
  element_type *local_10c8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_10c0;
  shared_ptr<chrono::ChBodyFrame> *local_10b8;
  element_type *local_10b0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_10a8;
  shared_ptr<chrono::ChBodyFrame> *local_10a0;
  element_type *local_1098;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1090;
  shared_ptr<chrono::ChBodyFrame> *local_1088;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_1080;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_1078;
  element_type *local_1070;
  shared_ptr<chrono::fea::ChElementBase> *local_1068;
  ChElementHexaCorot_20 *local_1060;
  shared_ptr<chrono::fea::ChContinuumElastic> *local_1058;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1050;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1048;
  element_type *local_1040;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1038;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1030;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1028;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1020;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1018;
  undefined1 *local_1010;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1008;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_1000;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_ff8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_ff0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_fe8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_fe0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_fd8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> *local_fd0;
  code *local_fc8;
  element_type *local_fc0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_fb8;
  element_type *local_fb0;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_fa8;
  element_type *local_fa0;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_f98;
  element_type *local_f90;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_f88;
  element_type *local_f80;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_f78;
  element_type *local_f70;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_f68;
  element_type *local_f60;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_f58;
  element_type *local_f50;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_f48;
  element_type *local_f40;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_f38;
  element_type *local_f30;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_f28;
  element_type *local_f20;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_f18;
  element_type *local_f10;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_f08;
  element_type *local_f00;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_ef8;
  element_type *local_ef0;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_ee8;
  element_type *local_ee0;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_ed8;
  element_type *local_ed0;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_ec8;
  element_type *local_ec0;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_eb8;
  element_type *local_eb0;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_ea8;
  element_type *local_ea0;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_e98;
  element_type *local_e90;
  shared_ptr<chrono::fea::ChNodeFEAbase> *local_e88;
  element_type *local_e80;
  element_type *local_e78;
  element_type *local_e70;
  element_type *local_e68;
  element_type *local_e60;
  element_type *local_e58;
  element_type *local_e50;
  element_type *local_e48;
  element_type *local_e40;
  element_type *local_e38;
  element_type *local_e30;
  element_type *local_e28;
  element_type *local_e20;
  element_type *local_e18;
  element_type *local_e10;
  element_type *local_e08;
  element_type *local_e00;
  element_type *local_df8;
  element_type *local_df0;
  element_type *local_de8;
  ChVector<double> local_de0;
  ChVector<double> local_dc8;
  ChVector<double> local_db0;
  ChVector<double> local_d98;
  ChVector<double> local_d80;
  ChVector<double> local_d68;
  ChVector<double> local_d50;
  ChVector<double> local_d38;
  shared_ptr<chrono::ChSolver> local_d20;
  undefined1 local_d10 [8];
  shared_ptr<chrono::ChSolverMINRES> solver;
  shared_ptr<chrono::ChPhysicsItem> local_cf0;
  shared_ptr<chrono::ChPhysicsItem> local_ce0;
  shared_ptr<chrono::ChPhysicsItem> local_cd0;
  shared_ptr<chrono::ChBodyFrame> local_cc0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_cb0;
  shared_ptr<chrono::ChBodyFrame> local_ca0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_c90;
  shared_ptr<chrono::ChBodyFrame> local_c80;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_c70;
  shared_ptr<chrono::ChBodyFrame> local_c60;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_c50;
  undefined1 local_c40 [8];
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint4;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint3;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint2;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint1;
  undefined1 local_bf0 [8];
  shared_ptr<chrono::ChBody> truss;
  shared_ptr<chrono::fea::ChElementBase> local_bd0;
  shared_ptr<chrono::fea::ChContinuumElastic> local_bc0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_bb0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_ba0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_b90;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_b80;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_b70;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_b60;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_b50;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_b40;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_b30;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_b20;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_b10;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_b00;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_af0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_ae0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_ad0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_ac0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_ab0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_aa0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_a90;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_a80;
  undefined1 local_a70 [8];
  shared_ptr<chrono::fea::ChElementHexaCorot_20> melement1;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_a50;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_a40;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_a30;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_a20;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_a10;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_a00;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_9f0;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_9e0;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_9d0;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_9c0;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_9b0;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_9a0;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_990;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_980;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_970;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_960;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_950;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_940;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_930;
  ChVector<double> local_920;
  ChVector<double> local_908;
  ChVector<double> local_8f0;
  ChVector<double> local_8d8;
  ChVector<double> local_8c0;
  ChVector<double> local_8a8;
  ChVector<double> local_890;
  ChVector<double> local_878;
  ChVector<double> local_860;
  ChVector<double> local_848;
  undefined1 local_830 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode20;
  ChVector<double> local_808;
  undefined1 local_7f0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode19;
  ChVector<double> local_7c8;
  undefined1 local_7b0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode18;
  ChVector<double> local_788;
  undefined1 local_770 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode17;
  ChVector<double> local_748;
  undefined1 local_730 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode16;
  ChVector<double> local_708;
  undefined1 local_6f0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode15;
  ChVector<double> local_6c8;
  undefined1 local_6b0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode14;
  ChVector<double> local_688;
  undefined1 local_670 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode13;
  ChVector<double> local_648;
  undefined1 local_630 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode12;
  ChVector<double> local_608;
  undefined1 local_5f0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode11;
  ChVector<double> local_5c8;
  undefined1 local_5b0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode10;
  ChVector<double> local_588;
  undefined1 local_570 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode9;
  undefined1 local_548 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode8;
  undefined1 local_520 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode7;
  undefined1 local_4f8 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode6;
  undefined1 local_4d0 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode5;
  undefined1 local_4a8 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode4;
  undefined1 local_480 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode3;
  undefined1 local_458 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode2;
  undefined1 local_430 [8];
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode1;
  double sz;
  double sy;
  double sx;
  shared_ptr<chrono::fea::ChContinuumElastic> mmaterial;
  undefined1 local_3e8 [8];
  shared_ptr<chrono::fea::ChMesh> my_mesh;
  ChSystemSMC sys;
  
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar1,"\n-------------------------------------------------\n");
  pCVar1 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar1,"TEST: QUADRATIC hexahedral element FEM  \n\n");
  chrono::ChSystemSMC::ChSystemSMC
            ((ChSystemSMC *)
             &my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,true);
  chrono_types::make_shared<chrono::fea::ChMesh,_0>();
  chrono_types::make_shared<chrono::fea::ChContinuumElastic,_0>();
  std::
  __shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&sx);
  chrono::fea::ChContinuumElastic::Set_E(207000000.0);
  std::
  __shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&sx);
  chrono::fea::ChContinuumElastic::Set_v(0.3);
  mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f847ae147ae147b;
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.0,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_430);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.0,
             (double)mnode1.
                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_458);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.01,0.0,
             (double)mnode1.
                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_480);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.01,0.0,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_4a8);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.1,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_4d0);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.0,0.1,
             (double)mnode1.
                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_4f8);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.01,0.1,
             (double)mnode1.
                     super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_520);
  chrono::ChVector<double>::ChVector
            ((ChVector<double> *)
             &mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.01,0.1,0.0);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_548);
  local_de8 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_430);
  local_de8 = local_de8 + 0x20;
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_458);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)local_de8,(ChVector<double> *)(peVar2 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_588,
             (ChVector<double> *)
             &mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_570);
  local_df0 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_458);
  local_df0 = local_df0 + 0x20;
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_480);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)local_df0,(ChVector<double> *)(peVar2 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_5c8,
             (ChVector<double> *)
             &mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_5b0);
  local_df8 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_480);
  local_df8 = local_df8 + 0x20;
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4a8);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)local_df8,(ChVector<double> *)(peVar2 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_608,
             (ChVector<double> *)
             &mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_5f0);
  local_e00 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_430);
  local_e00 = local_e00 + 0x20;
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4a8);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)local_e00,(ChVector<double> *)(peVar2 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_648,
             (ChVector<double> *)
             &mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_630);
  local_e08 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_4d0);
  local_e08 = local_e08 + 0x20;
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4f8);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)local_e08,(ChVector<double> *)(peVar2 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_688,
             (ChVector<double> *)
             &mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_670);
  local_e10 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_4f8);
  local_e10 = local_e10 + 0x20;
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_520);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)local_e10,(ChVector<double> *)(peVar2 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_6c8,
             (ChVector<double> *)
             &mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_6b0);
  local_e18 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_520);
  local_e18 = local_e18 + 0x20;
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_548);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)local_e18,(ChVector<double> *)(peVar2 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_708,
             (ChVector<double> *)
             &mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_6f0);
  local_e20 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_548);
  local_e20 = local_e20 + 0x20;
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4d0);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)local_e20,(ChVector<double> *)(peVar2 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_748,
             (ChVector<double> *)
             &mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_730);
  local_e28 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_458);
  local_e28 = local_e28 + 0x20;
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4f8);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)local_e28,(ChVector<double> *)(peVar2 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_788,
             (ChVector<double> *)
             &mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_770);
  local_e30 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_480);
  local_e30 = local_e30 + 0x20;
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_520);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)local_e30,(ChVector<double> *)(peVar2 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_7c8,
             (ChVector<double> *)
             &mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_7b0);
  local_e38 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_4a8);
  local_e38 = local_e38 + 0x20;
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_548);
  chrono::ChVector<double>::operator+
            ((ChVector<double> *)
             &mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChVector<double> *)local_e38,(ChVector<double> *)(peVar2 + 0x20));
  chrono::ChVector<double>::operator*
            (&local_808,
             (ChVector<double> *)
             &mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_7f0);
  local_e40 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_430);
  local_e40 = local_e40 + 0x20;
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4d0);
  chrono::ChVector<double>::operator+
            (&local_860,(ChVector<double> *)local_e40,(ChVector<double> *)(peVar2 + 0x20));
  chrono::ChVector<double>::operator*(&local_848,&local_860,0.5);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyz,_chrono::ChVector<double>,_0>
            ((ChVector<double> *)local_830);
  local_e48 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_4d0);
  chrono::ChVector<double>::ChVector(&local_878,0.0,-500.0,0.0);
  (**(code **)(*(long *)local_e48 + 0x68))(local_e48,&local_878);
  local_e50 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_4f8);
  chrono::ChVector<double>::ChVector(&local_890,0.0,-500.0,0.0);
  (**(code **)(*(long *)local_e50 + 0x68))(local_e50,&local_890);
  local_e58 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_520);
  chrono::ChVector<double>::ChVector(&local_8a8,0.0,-500.0,0.0);
  (**(code **)(*(long *)local_e58 + 0x68))(local_e58,&local_8a8);
  local_e60 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_548);
  chrono::ChVector<double>::ChVector(&local_8c0,0.0,-500.0,0.0);
  (**(code **)(*(long *)local_e60 + 0x68))(local_e60,&local_8c0);
  local_e68 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_670);
  chrono::ChVector<double>::ChVector(&local_8d8,0.0,-500.0,0.0);
  (**(code **)(*(long *)local_e68 + 0x68))(local_e68,&local_8d8);
  local_e70 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_6b0);
  chrono::ChVector<double>::ChVector(&local_8f0,0.0,-500.0,0.0);
  (**(code **)(*(long *)local_e70 + 0x68))(local_e70,&local_8f0);
  local_e78 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_6f0);
  chrono::ChVector<double>::ChVector(&local_908,0.0,-500.0,0.0);
  (**(code **)(*(long *)local_e78 + 0x68))(local_e78,&local_908);
  local_e80 = std::
              __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_730);
  chrono::ChVector<double>::ChVector(&local_920,0.0,-500.0,0.0);
  (**(code **)(*(long *)local_e80 + 0x68))(local_e80,&local_920);
  local_e90 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_e88 = &local_930;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_e88,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_430);
  chrono::fea::ChMesh::AddNode(local_e90,local_e88);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_930);
  local_ea0 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_e98 = &local_940;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_e98,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_458);
  chrono::fea::ChMesh::AddNode(local_ea0,local_e98);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_940);
  local_eb0 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_ea8 = &local_950;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_ea8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_480);
  chrono::fea::ChMesh::AddNode(local_eb0,local_ea8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_950);
  local_ec0 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_eb8 = &local_960;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_eb8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4a8);
  chrono::fea::ChMesh::AddNode(local_ec0,local_eb8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_960);
  local_ed0 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_ec8 = &local_970;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_ec8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4d0);
  chrono::fea::ChMesh::AddNode(local_ed0,local_ec8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_970);
  local_ee0 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_ed8 = &local_980;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_ed8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4f8);
  chrono::fea::ChMesh::AddNode(local_ee0,local_ed8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_980);
  local_ef0 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_ee8 = &local_990;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_ee8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_520);
  chrono::fea::ChMesh::AddNode(local_ef0,local_ee8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_990);
  local_f00 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_ef8 = &local_9a0;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_ef8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_548);
  chrono::fea::ChMesh::AddNode(local_f00,local_ef8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_9a0);
  local_f10 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_f08 = &local_9b0;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_f08,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_570);
  chrono::fea::ChMesh::AddNode(local_f10,local_f08);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_9b0);
  local_f20 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_f18 = &local_9c0;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_f18,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_5b0);
  chrono::fea::ChMesh::AddNode(local_f20,local_f18);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_9c0);
  local_f30 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_f28 = &local_9d0;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_f28,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_5f0);
  chrono::fea::ChMesh::AddNode(local_f30,local_f28);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_9d0);
  local_f40 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_f38 = &local_9e0;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_f38,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_630);
  chrono::fea::ChMesh::AddNode(local_f40,local_f38);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_9e0);
  local_f50 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_f48 = &local_9f0;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_f48,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_670);
  chrono::fea::ChMesh::AddNode(local_f50,local_f48);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_9f0);
  local_f60 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_f58 = &local_a00;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_f58,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_6b0);
  chrono::fea::ChMesh::AddNode(local_f60,local_f58);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_a00);
  local_f70 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_f68 = &local_a10;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_f68,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_6f0);
  chrono::fea::ChMesh::AddNode(local_f70,local_f68);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_a10);
  local_f80 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_f78 = &local_a20;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_f78,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_730);
  chrono::fea::ChMesh::AddNode(local_f80,local_f78);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_a20);
  local_f90 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_f88 = &local_a30;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_f88,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_770);
  chrono::fea::ChMesh::AddNode(local_f90,local_f88);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_a30);
  local_fa0 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_f98 = &local_a40;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_f98,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_7b0);
  chrono::fea::ChMesh::AddNode(local_fa0,local_f98);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_a40);
  local_fb0 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_fa8 = &local_a50;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_fa8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_7f0);
  chrono::fea::ChMesh::AddNode(local_fb0,local_fa8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr(&local_a50);
  local_fc0 = std::
              __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_3e8);
  local_fb8 = &melement1.
               super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            ((shared_ptr<chrono::fea::ChNodeFEAbase> *)local_fb8,
             (shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_830);
  chrono::fea::ChMesh::AddNode(local_fc0,local_fb8);
  std::shared_ptr<chrono::fea::ChNodeFEAbase>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAbase> *)
             &melement1.
              super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono_types::make_shared<chrono::fea::ChElementHexaCorot_20,_0>();
  local_1040 = std::
               __shared_ptr_access<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a70);
  local_1038 = &local_a80;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_1038,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_430);
  local_1030 = &local_a90;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_1030,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_458);
  local_1028 = &local_aa0;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_1028,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_480);
  local_1020 = &local_ab0;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_1020,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4a8);
  local_1018 = &local_ac0;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_1018,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4d0);
  local_1048 = &local_ad0;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_1048,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4f8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_ae0,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_520);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_af0,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_548);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_b00,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_570);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_b10,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_5b0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (&local_b20,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_5f0);
  local_fd0 = &local_b30;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_fd0,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_630);
  local_fd8 = &local_b40;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_fd8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_670);
  local_fe0 = &local_b50;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_fe0,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_6b0);
  local_fe8 = &local_b60;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_fe8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_6f0);
  local_ff0 = &local_b70;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_ff0,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_730);
  local_ff8 = &local_b80;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_ff8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_770);
  local_1000 = &local_b90;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_1000,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_7b0);
  local_1008 = &local_ba0;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_1008,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_7f0);
  local_1050 = &local_bb0;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_1050,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_830);
  local_fc8 = *(code **)(*(long *)local_1040 + 0x38);
  local_11b8 = local_1050;
  local_11c0 = local_1008;
  local_11c8 = local_1000;
  local_11d0 = local_ff8;
  local_11d8 = local_ff0;
  local_11e0 = local_fe8;
  local_11e8 = local_fe0;
  local_11f0 = local_fd8;
  local_11f8 = local_fd0;
  local_1228 = local_1048;
  local_1220 = &local_ae0;
  local_1218 = &local_af0;
  local_1210 = &local_b00;
  local_1208 = &local_b10;
  local_1200 = &local_b20;
  local_1010 = (undefined1 *)&local_1228;
  (*local_fc8)(local_1040,local_1038,local_1030,local_1028,local_1020,local_1018);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_bb0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_ba0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_b90);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_b80);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_b70);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_b60);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_b50);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_b40);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_b30);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_b20);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_b10);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_b00);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_af0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_ae0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_ad0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_ac0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_ab0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_aa0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_a90);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_a80);
  local_1060 = std::
               __shared_ptr_access<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_a70);
  local_1058 = &local_bc0;
  std::shared_ptr<chrono::fea::ChContinuumElastic>::shared_ptr
            (local_1058,(shared_ptr<chrono::fea::ChContinuumElastic> *)&sx);
  chrono::fea::ChElementHexaCorot_20::SetMaterial(local_1060,local_1058);
  std::shared_ptr<chrono::fea::ChContinuumElastic>::~shared_ptr(&local_bc0);
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a70);
  (**(code **)(*(long *)peVar3 + 0x48))();
  local_1070 = std::
               __shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_3e8);
  local_1068 = &local_bd0;
  std::shared_ptr<chrono::fea::ChElementBase>::shared_ptr<chrono::fea::ChElementHexaCorot_20,void>
            (local_1068,(shared_ptr<chrono::fea::ChElementHexaCorot_20> *)local_a70);
  chrono::fea::ChMesh::AddElement(local_1070,local_1068);
  std::shared_ptr<chrono::fea::ChElementBase>::~shared_ptr(&local_bd0);
  local_1078 = &truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChMesh,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)local_1078,
             (shared_ptr<chrono::fea::ChMesh> *)local_3e8);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,local_1078);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  chrono_types::make_shared<chrono::ChBody,_0>();
  local_1080 = &constraint1.
                super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::ChBody,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)local_1080,(shared_ptr<chrono::ChBody> *)local_bf0
            );
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,local_1080);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar4 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_bf0);
  chrono::ChBody::SetBodyFixed(SUB81(peVar4,0));
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  chrono_types::make_shared<chrono::fea::ChLinkPointFrame,_0>();
  local_1098 = std::
               __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&constraint2.
                                super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
  local_1090 = &local_c50;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_1090,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_430);
  local_1088 = &local_c60;
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (local_1088,(shared_ptr<chrono::ChBody> *)local_bf0);
  (**(code **)(*(long *)local_1098 + 0x220))(local_1098,local_1090,local_1088,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_c60);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_c50);
  local_10b0 = std::
               __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&constraint3.
                                super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
  local_10a8 = &local_c70;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_10a8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_458);
  local_10a0 = &local_c80;
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (local_10a0,(shared_ptr<chrono::ChBody> *)local_bf0);
  (**(code **)(*(long *)local_10b0 + 0x220))(local_10b0,local_10a8,local_10a0,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_c80);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_c70);
  local_10c8 = std::
               __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&constraint4.
                                super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
  local_10c0 = &local_c90;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_10c0,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_480);
  local_10b8 = &local_ca0;
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (local_10b8,(shared_ptr<chrono::ChBody> *)local_bf0);
  (**(code **)(*(long *)local_10c8 + 0x220))(local_10c8,local_10c0,local_10b8,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_ca0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_c90);
  local_10e0 = std::
               __shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_c40);
  local_10d8 = &local_cb0;
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::shared_ptr
            (local_10d8,(shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4a8);
  local_10d0 = &local_cc0;
  std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBody,void>
            (local_10d0,(shared_ptr<chrono::ChBody> *)local_bf0);
  (**(code **)(*(long *)local_10e0 + 0x220))(local_10e0,local_10d8,local_10d0,0);
  std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr(&local_cc0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr(&local_cb0);
  local_10e8 = &local_cd0;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_10e8,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,local_10e8);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_cd0);
  local_10f0 = &local_ce0;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_10f0,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,local_10f0);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_ce0);
  local_10f8 = &local_cf0;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_10f8,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint4.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,local_10f8);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_cf0);
  local_1100 = &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::fea::ChLinkPointFrame,void>
            ((shared_ptr<chrono::ChPhysicsItem> *)local_1100,
             (shared_ptr<chrono::fea::ChLinkPointFrame> *)local_c40);
  chrono::ChSystem::Add
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,local_1100);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
            ((shared_ptr<chrono::ChPhysicsItem> *)
             &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono_types::make_shared<chrono::ChSolverMINRES,_0>();
  local_1108 = &local_d20;
  std::shared_ptr<chrono::ChSolver>::shared_ptr<chrono::ChSolverMINRES,void>
            (local_1108,(shared_ptr<chrono::ChSolverMINRES> *)local_d10);
  chrono::ChSystem::SetSolver
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,local_1108);
  std::shared_ptr<chrono::ChSolver>::~shared_ptr(&local_d20);
  peVar5 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d10);
  chrono::ChIterativeSolver::SetMaxIterations((ChIterativeSolver *)peVar5,100);
  peVar5 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d10);
  chrono::ChIterativeSolver::SetTolerance((ChIterativeSolver *)peVar5,1e-12);
  peVar5 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d10);
  chrono::ChIterativeSolver::EnableDiagonalPreconditioner((ChIterativeSolver *)peVar5,true);
  peVar5 = std::
           __shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d10);
  chrono::ChSolver::SetVerbose((ChSolver *)(peVar5 + 0x18),true);
  chrono::ChSystem::DoStaticLinear();
  local_1110 = (ChStreamOutAscii *)chrono::GetLog();
  local_1118 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_1110,"node5 displ: ");
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4d0);
  local_1120 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar2 + 0x18));
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4d0);
  (**(code **)(*(long *)peVar2 + 0x60))(&local_d50);
  chrono::ChVector<double>::operator-(&local_d38,local_1120,&local_d50);
  local_1128 = chrono::operator<<(local_1118,&local_d38);
  chrono::ChStreamOutAscii::operator<<(local_1128,"\n");
  local_1130 = (ChStreamOutAscii *)chrono::GetLog();
  local_1138 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_1130,"node6 displ: ");
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4f8);
  local_1140 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar2 + 0x18));
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_4f8);
  (**(code **)(*(long *)peVar2 + 0x60))(&local_d80);
  chrono::ChVector<double>::operator-(&local_d68,local_1140,&local_d80);
  local_1148 = chrono::operator<<(local_1138,&local_d68);
  chrono::ChStreamOutAscii::operator<<(local_1148,"\n");
  local_1150 = (ChStreamOutAscii *)chrono::GetLog();
  local_1158 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_1150,"node7 displ: ");
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_520);
  local_1160 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar2 + 0x18));
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_520);
  (**(code **)(*(long *)peVar2 + 0x60))(&local_db0);
  chrono::ChVector<double>::operator-(&local_d98,local_1160,&local_db0);
  local_1168 = chrono::operator<<(local_1158,&local_d98);
  chrono::ChStreamOutAscii::operator<<(local_1168,"\n");
  local_1170 = (ChStreamOutAscii *)chrono::GetLog();
  local_1178 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_1170,"node8 displ: ");
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_548);
  local_1180 = chrono::ChNodeXYZ::GetPos((ChNodeXYZ *)(peVar2 + 0x18));
  peVar2 = std::
           __shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_548);
  (**(code **)(*(long *)peVar2 + 0x60))(&local_de0);
  chrono::ChVector<double>::operator-(&local_dc8,local_1180,&local_de0);
  local_1188 = chrono::operator<<(local_1178,&local_dc8);
  chrono::ChStreamOutAscii::operator<<(local_1188,"\n");
  local_1190 = (ChStreamOutAscii *)chrono::GetLog();
  local_1198 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_1190,"Element volume")
  ;
  peVar3 = std::
           __shared_ptr_access<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a70);
  local_11a0 = chrono::fea::ChElementHexaCorot_20::GetVolume(peVar3);
  local_11a8 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(local_1198,local_11a0);
  chrono::ChStreamOutAscii::operator<<(local_11a8,"\n");
  std::shared_ptr<chrono::ChSolverMINRES>::~shared_ptr
            ((shared_ptr<chrono::ChSolverMINRES> *)local_d10);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)local_c40);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint4.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<chrono::fea::ChLinkPointFrame>::~shared_ptr
            ((shared_ptr<chrono::fea::ChLinkPointFrame> *)
             &constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)local_bf0);
  std::shared_ptr<chrono::fea::ChElementHexaCorot_20>::~shared_ptr
            ((shared_ptr<chrono::fea::ChElementHexaCorot_20> *)local_a70);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_830);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_7f0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_7b0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_770);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_730);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_6f0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_6b0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_670);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_630);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_5f0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_5b0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_570);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_548);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_520);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4f8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4d0);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_4a8);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_480);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_458);
  std::shared_ptr<chrono::fea::ChNodeFEAxyz>::~shared_ptr
            ((shared_ptr<chrono::fea::ChNodeFEAxyz> *)local_430);
  std::shared_ptr<chrono::fea::ChContinuumElastic>::~shared_ptr
            ((shared_ptr<chrono::fea::ChContinuumElastic> *)&sx);
  std::shared_ptr<chrono::fea::ChMesh>::~shared_ptr((shared_ptr<chrono::fea::ChMesh> *)local_3e8);
  chrono::ChSystemSMC::~ChSystemSMC
            ((ChSystemSMC *)
             &my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void test_5() {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: QUADRATIC hexahedral element FEM  \n\n";

    // The physical system: it contains all physical objects.
    ChSystemSMC sys;

    // Create a mesh, that is a container for groups
    // of elements and their referenced nodes.
    auto my_mesh = chrono_types::make_shared<ChMesh>();

    // Create a material, that must be assigned to each element,
    // and set its parameters
    auto mmaterial = chrono_types::make_shared<ChContinuumElastic>();
    mmaterial->Set_E(207e6);
    mmaterial->Set_v(0.3);

    // Create some nodes. These are the classical point-like
    // nodes with x,y,z degrees of freedom, that can be used
    // for many types of FEM elements in space.
    // While creating them, also set X0 undeformed positions.
    double sx = 0.01;
    double sy = 0.1;
    double sz = 0.01;
    auto mnode1 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0));
    auto mnode2 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, sz));
    auto mnode3 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, 0, sz));
    auto mnode4 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, 0, 0));
    auto mnode5 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, sy, 0));
    auto mnode6 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, sy, sz));
    auto mnode7 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, sy, sz));
    auto mnode8 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, sy, 0));
    auto mnode9 = chrono_types::make_shared<ChNodeFEAxyz>((mnode1->pos + mnode2->pos) * 0.5);  // in between front face
    auto mnode10 = chrono_types::make_shared<ChNodeFEAxyz>((mnode2->pos + mnode3->pos) * 0.5);
    auto mnode11 = chrono_types::make_shared<ChNodeFEAxyz>((mnode3->pos + mnode4->pos) * 0.5);
    auto mnode12 = chrono_types::make_shared<ChNodeFEAxyz>((mnode1->pos + mnode4->pos) * 0.5);
    auto mnode13 = chrono_types::make_shared<ChNodeFEAxyz>((mnode5->pos + mnode6->pos) * 0.5);  // in between back face
    auto mnode14 = chrono_types::make_shared<ChNodeFEAxyz>((mnode6->pos + mnode7->pos) * 0.5);
    auto mnode15 = chrono_types::make_shared<ChNodeFEAxyz>((mnode7->pos + mnode8->pos) * 0.5);
    auto mnode16 = chrono_types::make_shared<ChNodeFEAxyz>((mnode8->pos + mnode5->pos) * 0.5);
    auto mnode17 = chrono_types::make_shared<ChNodeFEAxyz>((mnode2->pos + mnode6->pos) * 0.5);  // in between side edges
    auto mnode18 = chrono_types::make_shared<ChNodeFEAxyz>((mnode3->pos + mnode7->pos) * 0.5);
    auto mnode19 = chrono_types::make_shared<ChNodeFEAxyz>((mnode4->pos + mnode8->pos) * 0.5);
    auto mnode20 = chrono_types::make_shared<ChNodeFEAxyz>((mnode1->pos + mnode5->pos) * 0.5);

    // For example, set applied forces to nodes:
    mnode5->SetForce(ChVector<>(0, -500, 0));
    mnode6->SetForce(ChVector<>(0, -500, 0));
    mnode7->SetForce(ChVector<>(0, -500, 0));
    mnode8->SetForce(ChVector<>(0, -500, 0));
    mnode13->SetForce(ChVector<>(0, -500, 0));
    mnode14->SetForce(ChVector<>(0, -500, 0));
    mnode15->SetForce(ChVector<>(0, -500, 0));
    mnode16->SetForce(ChVector<>(0, -500, 0));

    // Remember to add nodes and elements to the mesh!
    my_mesh->AddNode(mnode1);
    my_mesh->AddNode(mnode2);
    my_mesh->AddNode(mnode3);
    my_mesh->AddNode(mnode4);
    my_mesh->AddNode(mnode5);
    my_mesh->AddNode(mnode6);
    my_mesh->AddNode(mnode7);
    my_mesh->AddNode(mnode8);
    my_mesh->AddNode(mnode9);
    my_mesh->AddNode(mnode10);
    my_mesh->AddNode(mnode11);
    my_mesh->AddNode(mnode12);
    my_mesh->AddNode(mnode13);
    my_mesh->AddNode(mnode14);
    my_mesh->AddNode(mnode15);
    my_mesh->AddNode(mnode16);
    my_mesh->AddNode(mnode17);
    my_mesh->AddNode(mnode18);
    my_mesh->AddNode(mnode19);
    my_mesh->AddNode(mnode20);

    // Create the tetrahedron element, and assign
    // its nodes and material
    auto melement1 = chrono_types::make_shared<ChElementHexaCorot_20>();
    melement1->SetNodes(mnode1, mnode2, mnode3, mnode4, mnode5, mnode6, mnode7, mnode8, mnode9, mnode10, mnode11,
                        mnode12, mnode13, mnode14, mnode15, mnode16, mnode17, mnode18, mnode19, mnode20);
    melement1->SetMaterial(mmaterial);

    // Use this statement to use the reduced integration
    // Default number of gauss point: 27. Reduced integration -> 8 Gp.
    melement1->SetReducedIntegrationRule();

    // Remember to add elements to the mesh!
    my_mesh->AddElement(melement1);

    // Remember to add the mesh to the system!
    sys.Add(my_mesh);

    // Create also a truss
    auto truss = chrono_types::make_shared<ChBody>();
    sys.Add(truss);
    truss->SetBodyFixed(true);

    // Create a constraint between a node and the truss
    auto constraint1 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint2 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint3 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint4 = chrono_types::make_shared<ChLinkPointFrame>();

    constraint1->Initialize(mnode1,   // node
                            truss);   // body to be connected to

    constraint2->Initialize(mnode2,   // node
                            truss);   // body to be connected to

    constraint3->Initialize(mnode3,   // node
                            truss);   // body to be connected to

    constraint4->Initialize(mnode4,   // node
                            truss);   // body to be connected to

    sys.Add(constraint1);
    sys.Add(constraint2);
    sys.Add(constraint3);
    sys.Add(constraint4);

    // Set no gravity
    // sys.Set_G_acc(VNULL);

    // Perform a linear static analysis
    auto solver = chrono_types::make_shared<ChSolverMINRES>();
    sys.SetSolver(solver);
    solver->SetMaxIterations(100);
    solver->SetTolerance(1e-12);
    solver->EnableDiagonalPreconditioner(true);
    solver->SetVerbose(true);

    sys.DoStaticLinear();

    // Output some results
    GetLog() << "node5 displ: " << mnode5->GetPos() - mnode5->GetX0() << "\n";
    GetLog() << "node6 displ: " << mnode6->GetPos() - mnode6->GetX0() << "\n";
    GetLog() << "node7 displ: " << mnode7->GetPos() - mnode7->GetX0() << "\n";
    GetLog() << "node8 displ: " << mnode8->GetPos() - mnode8->GetX0() << "\n";
    GetLog() << "Element volume" << melement1->GetVolume() << "\n";
}